

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

TypedVector * __thiscall flexbuffers::Map::Keys(TypedVector *__return_storage_ptr__,Map *this)

{
  uint8_t *data;
  uint64_t uVar1;
  uint8_t *offset;
  uint8_t *keys_offset;
  size_t num_prefixed_fields;
  Map *this_local;
  
  offset = (this->super_Vector).super_Sized.super_Object.data_ +
           (ulong)(this->super_Vector).super_Sized.super_Object.byte_width_ * -3;
  data = Indirect(offset,(this->super_Vector).super_Sized.super_Object.byte_width_);
  uVar1 = ReadUInt64(offset + (int)(uint)(this->super_Vector).super_Sized.super_Object.byte_width_,
                     (this->super_Vector).super_Sized.super_Object.byte_width_);
  TypedVector::TypedVector(__return_storage_ptr__,data,(uint8_t)uVar1,FBT_KEY);
  return __return_storage_ptr__;
}

Assistant:

TypedVector Keys() const {
    const size_t num_prefixed_fields = 3;
    auto keys_offset = data_ - byte_width_ * num_prefixed_fields;
    return TypedVector(Indirect(keys_offset, byte_width_),
                       static_cast<uint8_t>(
                           ReadUInt64(keys_offset + byte_width_, byte_width_)),
                       FBT_KEY);
  }